

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O1

void DispatchAlphaToGreen_C
               (uint8_t *alpha,int alpha_stride,int width,int height,uint32_t *dst,int dst_stride)

{
  int iVar1;
  ulong uVar2;
  
  if (0 < height) {
    iVar1 = 0;
    do {
      if (0 < width) {
        uVar2 = 0;
        do {
          dst[uVar2] = (uint)alpha[uVar2] << 8;
          uVar2 = uVar2 + 1;
        } while ((uint)width != uVar2);
      }
      alpha = alpha + alpha_stride;
      iVar1 = iVar1 + 1;
      dst = dst + dst_stride;
    } while (iVar1 != height);
  }
  return;
}

Assistant:

static void DispatchAlphaToGreen_C(const uint8_t* WEBP_RESTRICT alpha,
                                   int alpha_stride, int width, int height,
                                   uint32_t* WEBP_RESTRICT dst,
                                   int dst_stride) {
  int i, j;
  for (j = 0; j < height; ++j) {
    for (i = 0; i < width; ++i) {
      dst[i] = alpha[i] << 8;  // leave A/R/B channels zero'd.
    }
    alpha += alpha_stride;
    dst += dst_stride;
  }
}